

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeIntError
DivisionHelper<unsigned_long,_unsigned_int,_0>::Divide
          (unsigned_long *t,uint *u,unsigned_long *result)

{
  unsigned_long *result_local;
  uint *u_local;
  unsigned_long *t_local;
  undefined4 local_4;
  
  if (*u == 0) {
    local_4 = SafeIntDivideByZero;
  }
  else if (*t == 0) {
    *result = 0;
    local_4 = SafeIntNoError;
  }
  else {
    *result = *t / (ulong)*u;
    local_4 = SafeIntNoError;
  }
  return local_4;
}

Assistant:

static SafeIntError Divide( const T& t, const U& u, T& result ) SAFEINT_NOTHROW
    {
        if( u == 0 )
            return SafeIntDivideByZero;

        if( t == 0 )
        {
            result = 0;
            return SafeIntNoError;
        }

        result = (T)( t/u );
        return SafeIntNoError;
    }